

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

type * __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
as<(anonymous_namespace)::ns::book3b>
          (type *__return_storage_ptr__,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  bool bVar1;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *pbVar2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  conv_error *this_01;
  error_category *peVar3;
  double dVar4;
  error_code ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  string_view_type local_30;
  
  bVar1 = json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_(anonymous_namespace)::ns::book3b,_void>
          ::is(this);
  if (bVar1) {
    (__return_storage_ptr__->author_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->author_).field_2;
    (__return_storage_ptr__->author_)._M_string_length = 0;
    (__return_storage_ptr__->author_).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->title_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->title_).field_2;
    (__return_storage_ptr__->title_)._M_string_length = 0;
    (__return_storage_ptr__->title_).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->price_ = 0.0;
    (__return_storage_ptr__->isbn_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->isbn_).field_2;
    (__return_storage_ptr__->isbn_)._M_string_length = 0;
    (__return_storage_ptr__->isbn_).field_2._M_local_buf[0] = '\0';
    val._M_dataplus._M_p = &DAT_00000006;
    val._M_string_length = (size_type)anon_var_dwarf_46c06f7;
    bVar1 = contains(this,(string_view_type *)&val);
    if (bVar1) {
      local_30._M_len = 6;
      local_30._M_str = "Author";
      pbVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)at(this,&local_30);
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as_string<std::allocator<char>>
                (&val,pbVar2);
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&val);
    }
    val._M_dataplus._M_p = &DAT_00000005;
    val._M_string_length = (size_type)anon_var_dwarf_46c0704;
    bVar1 = contains(this,(string_view_type *)&val);
    if (bVar1) {
      local_30._M_len = 5;
      local_30._M_str = "Title";
      pbVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)at(this,&local_30);
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as_string<std::allocator<char>>
                (&val,pbVar2);
      std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->title_);
      std::__cxx11::string::~string((string *)&val);
    }
    val._M_dataplus._M_p = &DAT_00000005;
    val._M_string_length = (size_type)anon_var_dwarf_46c0711;
    bVar1 = contains(this,(string_view_type *)&val);
    if (bVar1) {
      val._M_dataplus._M_p = &DAT_00000005;
      val._M_string_length = (size_type)anon_var_dwarf_46c0711;
      this_00 = at(this,(string_view_type *)&val);
      dVar4 = as_double(this_00);
      __return_storage_ptr__->price_ = dVar4;
    }
    val._M_dataplus._M_p = (pointer)0x4;
    val._M_string_length = (size_type)anon_var_dwarf_46c07ba;
    bVar1 = contains(this,(string_view_type *)&val);
    if (bVar1) {
      local_30._M_len = 4;
      local_30._M_str = "Isbn";
      pbVar2 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)at(this,&local_30);
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as_string<std::allocator<char>>
                (&val,pbVar2);
      std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->isbn_);
      std::__cxx11::string::~string((string *)&val);
    }
    return __return_storage_ptr__;
  }
  this_01 = (conv_error *)__cxa_allocate_exception(0x58);
  peVar3 = conv_error_category();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&val,"Not a ns::book3b",(allocator<char> *)&local_30);
  ec._M_cat = peVar3;
  ec._0_8_ = 1;
  conv_error::conv_error(this_01,ec,&val);
  __cxa_throw(this_01,&conv_error::typeinfo,conv_error::~conv_error);
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }